

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::dump
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor)

{
  ser_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  dump_noflush(this,visitor,&ec);
  if (ec._M_value == 0) {
    (*visitor->_vptr_basic_json_visitor[2])(visitor);
  }
  if (ec._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void dump(basic_json_visitor<char_type>& visitor) const
        {
            std::error_code ec;
            dump(visitor, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec));
            }
        }